

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O2

void __thiscall Js::MemoryLogger::MemoryLogger(MemoryLogger *this,TAllocator *alloc,ULONG count)

{
  char16_t **ppcVar1;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR_Write_01376128;
  this->m_current = 0;
  this->m_capacity = count;
  this->m_alloc = alloc;
  CCLock::CCLock(&(this->m_criticalSection).super_CCLock,true);
  ppcVar1 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t*,false>
                      ((Memory *)this->m_alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0
                       ,(ulong)this->m_capacity);
  this->m_log = ppcVar1;
  return;
}

Assistant:

MemoryLogger::MemoryLogger(TAllocator* alloc, ULONG count) : m_alloc(alloc), m_capacity(count), m_current(0)
    {
        m_log = AnewArrayZ(m_alloc, char16*, m_capacity);
    }